

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O2

vector<float,_std::allocator<float>_> *
irwincolor::lab2xyz(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                   vector<float,_std::allocator<float>_> *lab)

{
  float *pfVar1;
  pointer pfVar2;
  double dVar3;
  float fVar4;
  double dVar5;
  double __x;
  allocator_type local_21;
  double local_20;
  double local_18;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,3,&local_21);
  pfVar1 = (lab->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  __x = (double)((*pfVar1 + 16.0) / 116.0);
  dVar5 = (double)pfVar1[2] / -200.0 + __x;
  dVar3 = (double)(float)((double)pfVar1[1] / 500.0 + __x);
  if (dVar3 <= 0.206893) {
    dVar3 = (dVar3 + -0.13793103448275862) / 7.787;
  }
  else {
    local_20 = __x;
    local_18 = dVar5;
    dVar3 = pow(dVar3,3.0);
    dVar5 = local_18;
    __x = local_20;
  }
  fVar4 = (float)dVar5;
  pfVar2 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pfVar2 = (float)dVar3 * 95.047;
  if (__x <= 0.206893) {
    dVar5 = (__x + -0.13793103448275862) / 7.787;
  }
  else {
    local_20 = (double)CONCAT44(local_20._4_4_,fVar4);
    dVar5 = pow(__x,3.0);
    pfVar2 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    fVar4 = local_20._0_4_;
  }
  pfVar2[1] = (float)dVar5 * 100.0;
  dVar5 = (double)fVar4;
  if (dVar5 <= 0.206893) {
    dVar5 = (dVar5 + -0.13793103448275862) / 7.787;
  }
  else {
    dVar5 = pow(dVar5,3.0);
    pfVar2 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  pfVar2[2] = (float)dVar5 * 108.883;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> lab2xyz(const std::vector<float>& lab)
{
	std::vector<float> xyz(3);
	float fy = (lab[0] + 16.0) / 116.0;
	float fx = lab[1] / 500.0 + fy;
	float fz = fy - lab[2] / 200.0;
	const float xn = 95.047, yn = 100.0, zn = 108.883;
	xyz[0] = labFuncInv(fx) * xn;
	xyz[1] = labFuncInv(fy) * yn;
	xyz[2] = labFuncInv(fz) * zn;
	//std::cout << "lab2xyz: xyz = " << xyz << std::endl;
	return xyz;
}